

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet++.cpp
# Opt level: O2

bool __thiscall
jsonnet::Jsonnet::evaluateFileMulti
          (Jsonnet *this,string *filename,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputs)

{
  char *jsonnet_output;
  bool bVar1;
  int error;
  int local_2c;
  
  if (outputs ==
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    bVar1 = false;
  }
  else {
    local_2c = 0;
    jsonnet_output =
         (char *)jsonnet_evaluate_file_multi(this->vm_,(filename->_M_dataplus)._M_p,&local_2c);
    bVar1 = local_2c == 0;
    if (bVar1) {
      anon_unknown_1::parseMultiOutput(jsonnet_output,outputs);
    }
    else {
      std::__cxx11::string::assign((char *)&this->last_error_);
    }
    jsonnet_realloc(this->vm_,jsonnet_output,0);
  }
  return bVar1;
}

Assistant:

bool Jsonnet::evaluateFileMulti(const std::string& filename,
                                std::map<std::string, std::string>* outputs)
{
    if (outputs == nullptr) {
        return false;
    }
    int error = 0;
    char* jsonnet_output = ::jsonnet_evaluate_file_multi(vm_, filename.c_str(), &error);
    if (error != 0) {
        last_error_.assign(jsonnet_output);
        jsonnet_realloc(vm_, jsonnet_output, 0);
        return false;
    }
    parseMultiOutput(jsonnet_output, outputs);
    jsonnet_realloc(vm_, jsonnet_output, 0);
    return true;
}